

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_p2sh_tests.cpp
# Opt level: O2

void __thiscall script_p2sh_tests::set::test_method(set *this)

{
  long lVar1;
  pointer pCVar2;
  pointer pCVar3;
  bool bVar4;
  long lVar5;
  int i;
  CScript *in;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  CKey *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_01;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  CMutableTransaction *assertion_descr;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  char *in_stack_fffffffffffff710;
  undefined1 *local_8e0;
  undefined1 *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  assertion_result local_880;
  undefined1 *local_868;
  undefined1 *local_860;
  char *local_858;
  char *local_850;
  int local_844;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  CMutableTransaction txFrom;
  char *local_7d8;
  char *local_7d0;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  vector<CPubKey,_std::allocator<CPubKey>_> keys;
  string local_758;
  undefined1 local_738 [32];
  CTransaction local_718;
  SignatureData empty;
  CMutableTransaction txTo [4];
  string reason;
  CScript outer [4];
  CScript inner [4];
  CKey key [4];
  FillableSigningProvider keystore;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_0114aee0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  lVar5 = 0;
  do {
    (&key[0].fCompressed)[lVar5] = false;
    *(undefined8 *)
     ((long)&key[0].keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> + lVar5) = 0;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<CPubKey,_std::allocator<CPubKey>_>::reserve(&keys,4);
  for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 0x10) {
    this_00 = (CKey *)(&key[0].fCompressed + lVar5);
    CKey::MakeNewKey(this_00,true);
    local_788 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_780 = "";
    local_798 = &boost::unit_test::basic_cstring<char_const>::null;
    local_790 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0xab;
    file.m_begin = (iterator)&local_788;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_798,msg);
    bVar4 = FillableSigningProvider::AddKey(&keystore,this_00);
    txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT71(txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
    txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    inner[0].super_CScriptBase._union.indirect_contents.indirect = "keystore.AddKey(key[i])";
    inner[0].super_CScriptBase._union._8_8_ = (long)"keystore.AddKey(key[i])" + 0x17;
    empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
         (char *)((ulong)empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
                 0xffffffffffffff00);
    empty._0_8_ = &PTR__lazy_ostream_0113a070;
    empty.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
    empty.scriptSig.super_CScriptBase._union._16_8_ = inner;
    local_7a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_7a0 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)txTo,(lazy_ostream *)&empty,1,0,WARN,
               (check_type)in_stack_fffffffffffff710,(size_t)&local_7a8,0xab);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    CKey::GetPubKey((CPubKey *)&empty,this_00);
    std::vector<CPubKey,_std::allocator<CPubKey>_>::emplace_back<CPubKey>(&keys,(CPubKey *)&empty);
  }
  inner[3].super_CScriptBase._union._16_8_ = 0;
  inner[3].super_CScriptBase._24_8_ = 0;
  inner[3].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  inner[3].super_CScriptBase._union._8_8_ = 0;
  inner[2].super_CScriptBase._union._16_8_ = 0;
  inner[2].super_CScriptBase._24_8_ = 0;
  inner[2].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  inner[2].super_CScriptBase._union._8_8_ = 0;
  inner[1].super_CScriptBase._union._16_8_ = 0;
  inner[1].super_CScriptBase._24_8_ = 0;
  inner[1].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  inner[1].super_CScriptBase._union._8_8_ = 0;
  inner[0].super_CScriptBase._union._16_8_ = 0;
  inner[0].super_CScriptBase._24_8_ = 0;
  inner[0].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  inner[0].super_CScriptBase._union._8_8_ = 0;
  CKey::GetPubKey((CPubKey *)txTo,key);
  PKHash::PKHash((PKHash *)&local_718,(CPubKey *)txTo);
  empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity =
       local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_;
  empty._0_8_ = local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
  empty.witness_script.super_CScriptBase._union.direct[0] = '\x02';
  GetScriptForDestination(outer,(CTxDestination *)&empty);
  this_01 = &inner[0].super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=(this_01,&outer[0].super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&outer[0].super_CScriptBase);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&empty);
  std::vector<CPubKey,std::allocator<CPubKey>>::
  vector<__gnu_cxx::__normal_iterator<CPubKey*,std::vector<CPubKey,std::allocator<CPubKey>>>,void>
            ((vector<CPubKey,std::allocator<CPubKey>> *)txTo,
             (__normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>)
             keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_start,
             keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_start + 2,(allocator_type *)outer);
  GetScriptForMultisig((CScript *)&empty,2,(vector<CPubKey,_std::allocator<CPubKey>_> *)txTo);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&inner[1].super_CScriptBase,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty)
  ;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty);
  std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base
            ((_Vector_base<CPubKey,_std::allocator<CPubKey>_> *)txTo);
  std::vector<CPubKey,std::allocator<CPubKey>>::
  vector<__gnu_cxx::__normal_iterator<CPubKey*,std::vector<CPubKey,std::allocator<CPubKey>>>,void>
            ((vector<CPubKey,std::allocator<CPubKey>> *)txTo,
             (__normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>)
             keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_start,
             keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_start + 2,(allocator_type *)outer);
  GetScriptForMultisig((CScript *)&empty,1,(vector<CPubKey,_std::allocator<CPubKey>_> *)txTo);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&inner[2].super_CScriptBase,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty)
  ;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty);
  std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base
            ((_Vector_base<CPubKey,_std::allocator<CPubKey>_> *)txTo);
  other = &outer[0].super_CScriptBase;
  std::vector<CPubKey,std::allocator<CPubKey>>::
  vector<__gnu_cxx::__normal_iterator<CPubKey*,std::vector<CPubKey,std::allocator<CPubKey>>>,void>
            ((vector<CPubKey,std::allocator<CPubKey>> *)txTo,
             (__normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>)
             keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_start,
             keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_start + 3,(allocator_type *)other);
  GetScriptForMultisig((CScript *)&empty,2,(vector<CPubKey,_std::allocator<CPubKey>_> *)txTo);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&inner[3].super_CScriptBase,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty)
  ;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty);
  std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base
            ((_Vector_base<CPubKey,_std::allocator<CPubKey>_> *)txTo);
  outer[3].super_CScriptBase._union._16_8_ = 0;
  outer[3].super_CScriptBase._24_8_ = 0;
  outer[3].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  outer[3].super_CScriptBase._union._8_8_ = 0;
  outer[2].super_CScriptBase._union._16_8_ = 0;
  outer[2].super_CScriptBase._24_8_ = 0;
  outer[2].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  outer[2].super_CScriptBase._union._8_8_ = 0;
  outer[1].super_CScriptBase._union._16_8_ = 0;
  outer[1].super_CScriptBase._24_8_ = 0;
  outer[1].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  outer[1].super_CScriptBase._union._8_8_ = 0;
  outer[0].super_CScriptBase._union._16_8_ = 0;
  outer[0].super_CScriptBase._24_8_ = 0;
  outer[0].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  outer[0].super_CScriptBase._union._8_8_ = 0;
  for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 0x20) {
    in = (CScript *)((long)&inner[0].super_CScriptBase._union + lVar5);
    ScriptHash::ScriptHash((ScriptHash *)&local_718,in);
    empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity =
         local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_;
    empty._0_8_ = local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start;
    empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
         (char *)local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    empty.witness_script.super_CScriptBase._union.direct[0] = '\x03';
    GetScriptForDestination((CScript *)txTo,(CTxDestination *)&empty);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&outer[0].super_CScriptBase._union + lVar5),
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)txTo);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)txTo);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&empty);
    local_7b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_7b0 = "";
    local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    file_00.m_end = (iterator)0xb9;
    file_00.m_begin = (iterator)&local_7b8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_7c8,
               msg_00);
    bVar4 = FillableSigningProvider::AddCScript(&keystore,in);
    txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT71(txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
    txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0xbc1cc7;
    local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xbc1ce4;
    empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
         (char *)((ulong)empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
                 0xffffffffffffff00);
    empty._0_8_ = &PTR__lazy_ostream_0113a070;
    empty.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
    empty.scriptSig.super_CScriptBase._union._16_8_ = &local_718;
    local_7d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_7d0 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)txTo,(lazy_ostream *)&empty,1,0,WARN,
               (check_type)in_stack_fffffffffffff710,(size_t)&local_7d8,0xb9);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  CMutableTransaction::CMutableTransaction(&txFrom);
  reason._M_dataplus._M_p = (pointer)&reason.field_2;
  reason._M_string_length = 0;
  reason.field_2._M_local_buf[0] = '\0';
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txFrom.vout,4);
  for (lVar5 = 8; lVar5 != 0xa8; lVar5 = lVar5 + 0x28) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&(txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue + lVar5),other);
    *(undefined8 *)
     ((long)txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start + lVar5 + -8) = 1000000;
    other = other + 1;
  }
  local_820 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_818 = "";
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  file_01.m_end = (iterator)0xc4;
  file_01.m_begin = (iterator)&local_820;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_830,
             msg_01);
  CTransaction::CTransaction((CTransaction *)&empty,&txFrom);
  bVar4 = IsStandardTx((CTransaction *)&empty,&reason);
  local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
  local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  txTo[0].vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_738;
  local_738._0_8_ = "IsStandardTx(CTransaction(txFrom), reason)";
  local_738._8_8_ = "";
  assertion_descr = txTo;
  txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                               .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_0113a070;
  txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_838 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_718,(lazy_ostream *)assertion_descr,1,0,WARN,
             (check_type)in_stack_fffffffffffff710,(size_t)&local_840,0xc4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CTransaction::~CTransaction((CTransaction *)&empty);
  lVar5 = 0;
  do {
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)
               ((long)&txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + 0x38;
  } while (lVar5 != 0xe0);
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&assertion_descr->vin,1);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&assertion_descr->vout,1);
    (((assertion_descr->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).n = (uint32_t)lVar5;
    CMutableTransaction::GetHash((Txid *)&empty,&txFrom);
    pCVar2 = (assertion_descr->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&(pCVar2->prevout).hash + 0x10) =
         empty.scriptSig.super_CScriptBase._union._8_8_;
    *(undefined8 *)((long)&(pCVar2->prevout).hash + 0x18) =
         empty.scriptSig.super_CScriptBase._union._16_8_;
    *(undefined8 *)&(pCVar2->prevout).hash = empty._0_8_;
    *(char **)((long)&(pCVar2->prevout).hash + 8) =
         empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect;
    pCVar3 = (assertion_descr->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar3->nValue = 1000000;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(pCVar3->scriptPubKey).super_CScriptBase,this_01);
    this_01 = this_01 + 1;
    assertion_descr = assertion_descr + 1;
  }
  for (local_844 = 0; local_844 < 4; local_844 = local_844 + 1) {
    empty._0_8_ = empty._0_8_ & 0xffffffffffff0000;
    empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    memset(&empty.scriptSig,0,0xb8);
    empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
    super__Optional_payload<TaprootBuilder,_true,_false,_false>.
    super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
    empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    empty.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    empty.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    empty.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    empty.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    empty.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    empty.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    empty.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_858 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_850 = "";
    local_868 = &boost::unit_test::basic_cstring<char_const>::null;
    local_860 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = pvVar7;
    msg_02.m_begin = pvVar6;
    file_02.m_end = (iterator)0xd3;
    file_02.m_begin = (iterator)&local_858;
    empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_868,
               msg_02);
    CTransaction::CTransaction(&local_718,&txFrom);
    local_880.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         SignSignature(&keystore.super_SigningProvider,&local_718,txTo + local_844,0,1,&empty);
    local_880.m_message.px = (element_type *)0x0;
    local_880.m_message.pn.pi_ = (sp_counted_base *)0x0;
    tinyformat::format<int>(&local_758,"SignSignature %d",&local_844);
    local_738._8_8_ = local_738._8_8_ & 0xffffffffffffff00;
    local_738._0_8_ = &PTR__lazy_ostream_01139e30;
    local_738._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_890 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_888 = "";
    pvVar6 = &DAT_00000001;
    pvVar7 = &DAT_00000001;
    local_738._24_8_ = &local_758;
    boost::test_tools::tt_detail::report_assertion
              (&local_880,(lazy_ostream *)local_738,1,1,WARN,(check_type)in_stack_fffffffffffff710,
               (size_t)&local_890,0xd3);
    std::__cxx11::string::~string((string *)&local_758);
    boost::detail::shared_count::~shared_count(&local_880.m_message.pn);
    CTransaction::~CTransaction(&local_718);
    local_8a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_898 = "";
    local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_03.m_end = pvVar7;
    msg_03.m_begin = pvVar6;
    file_03.m_end = (iterator)0xd4;
    file_03.m_begin = (iterator)&local_8a0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_8b0,
               msg_03);
    CTransaction::CTransaction(&local_718,txTo + local_844);
    local_880.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)IsStandardTx(&local_718,true,&reason);
    local_880.m_message.px = (element_type *)0x0;
    local_880.m_message.pn.pi_ = (sp_counted_base *)0x0;
    tinyformat::format<int>(&local_758,"txTo[%d].IsStandard",&local_844);
    local_738._8_8_ = local_738._8_8_ & 0xffffffffffffff00;
    local_738._0_8_ = &PTR__lazy_ostream_01139e30;
    local_738._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_8c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_8b8 = "";
    pvVar6 = &DAT_00000001;
    pvVar7 = &DAT_00000001;
    local_738._24_8_ = &local_758;
    boost::test_tools::tt_detail::report_assertion
              (&local_880,(lazy_ostream *)local_738,1,1,WARN,(check_type)in_stack_fffffffffffff710,
               (size_t)&local_8c0,0xd4);
    std::__cxx11::string::~string((string *)&local_758);
    boost::detail::shared_count::~shared_count(&local_880.m_message.pn);
    CTransaction::~CTransaction(&local_718);
    CTransaction::CTransaction(&local_718,txTo + local_844);
    bVar4 = IsStandardTx(&local_718,false,&reason);
    CTransaction::~CTransaction(&local_718);
    local_8d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_8c8 = "";
    local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_04.m_end = pvVar7;
    msg_04.m_begin = pvVar6;
    file_04.m_end = (iterator)0xd6;
    file_04.m_begin = (iterator)&local_8d0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_8e0,
               msg_04);
    local_758._M_dataplus._M_p._0_1_ = bVar4 != (local_844 != 0);
    local_758._M_string_length = 0;
    local_758.field_2._M_allocated_capacity = 0;
    tinyformat::format<int>
              ((string *)local_738,"txTo[%d].IsStandard(permbaremulti=false)",&local_844);
    local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((ulong)local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                 _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_01139e30;
    local_718.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    in_stack_fffffffffffff710 =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    pvVar6 = &DAT_00000001;
    pvVar7 = &DAT_00000001;
    local_718.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_738;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_758,(lazy_ostream *)&local_718,1,1,WARN,0xbc1ba0,
               (size_t)&stack0xfffffffffffff710,0xd6);
    std::__cxx11::string::~string((string *)local_738);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_758.field_2._M_allocated_capacity);
    SignatureData::~SignatureData(&empty);
  }
  lVar5 = 0xa8;
  do {
    CMutableTransaction::~CMutableTransaction
              ((CMutableTransaction *)
               ((long)&txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + -0x38;
  } while (lVar5 != -0x38);
  std::__cxx11::string::~string((string *)&reason);
  CMutableTransaction::~CMutableTransaction(&txFrom);
  lVar5 = 0x60;
  do {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&outer[0].super_CScriptBase._union + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lVar5 = 0x60;
  do {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&inner[0].super_CScriptBase._union + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base
            (&keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>);
  lVar5 = 0x38;
  do {
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   *)(&key[0].fCompressed + lVar5));
    lVar5 = lVar5 + -0x10;
  } while (lVar5 != -8);
  FillableSigningProvider::~FillableSigningProvider(&keystore);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(set)
{
    // Test the CScript::Set* methods
    FillableSigningProvider keystore;
    CKey key[4];
    std::vector<CPubKey> keys;
    keys.reserve(4);
    for (int i = 0; i < 4; i++)
    {
        key[i].MakeNewKey(true);
        BOOST_CHECK(keystore.AddKey(key[i]));
        keys.push_back(key[i].GetPubKey());
    }

    CScript inner[4];
    inner[0] = GetScriptForDestination(PKHash(key[0].GetPubKey()));
    inner[1] = GetScriptForMultisig(2, std::vector<CPubKey>(keys.begin(), keys.begin()+2));
    inner[2] = GetScriptForMultisig(1, std::vector<CPubKey>(keys.begin(), keys.begin()+2));
    inner[3] = GetScriptForMultisig(2, std::vector<CPubKey>(keys.begin(), keys.begin()+3));

    CScript outer[4];
    for (int i = 0; i < 4; i++)
    {
        outer[i] = GetScriptForDestination(ScriptHash(inner[i]));
        BOOST_CHECK(keystore.AddCScript(inner[i]));
    }

    CMutableTransaction txFrom;  // Funding transaction:
    std::string reason;
    txFrom.vout.resize(4);
    for (int i = 0; i < 4; i++)
    {
        txFrom.vout[i].scriptPubKey = outer[i];
        txFrom.vout[i].nValue = CENT;
    }
    BOOST_CHECK(IsStandardTx(CTransaction(txFrom), reason));

    CMutableTransaction txTo[4]; // Spending transactions
    for (int i = 0; i < 4; i++)
    {
        txTo[i].vin.resize(1);
        txTo[i].vout.resize(1);
        txTo[i].vin[0].prevout.n = i;
        txTo[i].vin[0].prevout.hash = txFrom.GetHash();
        txTo[i].vout[0].nValue = 1*CENT;
        txTo[i].vout[0].scriptPubKey = inner[i];
    }
    for (int i = 0; i < 4; i++)
    {
        SignatureData empty;
        BOOST_CHECK_MESSAGE(SignSignature(keystore, CTransaction(txFrom), txTo[i], 0, SIGHASH_ALL, empty), strprintf("SignSignature %d", i));
        BOOST_CHECK_MESSAGE(IsStandardTx(CTransaction(txTo[i]), /*permit_bare_multisig=*/true, reason), strprintf("txTo[%d].IsStandard", i));
        bool no_pbms_is_std = IsStandardTx(CTransaction(txTo[i]), /*permit_bare_multisig=*/false, reason);
        BOOST_CHECK_MESSAGE((i == 0 ? no_pbms_is_std : !no_pbms_is_std), strprintf("txTo[%d].IsStandard(permbaremulti=false)", i));
    }
}